

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

UBool __thiscall icu_63::OlsonTimeZone::hasSameRules(OlsonTimeZone *this,TimeZone *other)

{
  uint8_t *a1;
  void *a2;
  UBool UVar1;
  int16_t iVar2;
  bool local_41;
  long local_40;
  OlsonTimeZone *z;
  TimeZone *other_local;
  OlsonTimeZone *this_local;
  
  if (this == (OlsonTimeZone *)other) {
    this_local._7_1_ = true;
  }
  else {
    if (other == (TimeZone *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = __dynamic_cast(other,&TimeZone::typeinfo,&typeinfo,0);
    }
    if (local_40 == 0) {
      this_local._7_1_ = false;
    }
    else if (this->typeMapData == *(uint8_t **)(local_40 + 0x78)) {
      this_local._7_1_ = true;
    }
    else if ((((this->finalZone == (SimpleTimeZone *)0x0) && (*(long *)(local_40 + 0x80) != 0)) ||
             ((this->finalZone != (SimpleTimeZone *)0x0 && (*(long *)(local_40 + 0x80) == 0)))) ||
            (((this->finalZone != (SimpleTimeZone *)0x0 && (*(long *)(local_40 + 0x80) != 0)) &&
             (UVar1 = TimeZone::operator!=
                                ((TimeZone *)this->finalZone,*(TimeZone **)(local_40 + 0x80)),
             UVar1 != '\0')))) {
      this_local._7_1_ = false;
    }
    else if ((this->finalZone == (SimpleTimeZone *)0x0) ||
            (((this->finalStartYear == *(int *)(local_40 + 0x90) &&
              (this->finalStartMillis == *(double *)(local_40 + 0x88))) &&
             (!NAN(this->finalStartMillis) && !NAN(*(double *)(local_40 + 0x88)))))) {
      if (((this->typeCount == *(short *)(local_40 + 0x68)) &&
          (this->transitionCountPre32 == *(short *)(local_40 + 0x48))) &&
         ((this->transitionCount32 == *(short *)(local_40 + 0x4a) &&
          (this->transitionCountPost32 == *(short *)(local_40 + 0x4c))))) {
        UVar1 = arrayEqual(this->transitionTimesPre32,*(void **)(local_40 + 0x50),
                           (int)this->transitionCountPre32 << 3);
        local_41 = false;
        if (UVar1 != '\0') {
          UVar1 = arrayEqual(this->transitionTimes32,*(void **)(local_40 + 0x58),
                             (int)this->transitionCount32 << 2);
          local_41 = false;
          if (UVar1 != '\0') {
            UVar1 = arrayEqual(this->transitionTimesPost32,*(void **)(local_40 + 0x60),
                               (int)this->transitionCountPost32 << 3);
            local_41 = false;
            if (UVar1 != '\0') {
              UVar1 = arrayEqual(this->typeOffsets,*(void **)(local_40 + 0x70),
                                 (int)this->typeCount << 3);
              local_41 = false;
              if (UVar1 != '\0') {
                a1 = this->typeMapData;
                a2 = *(void **)(local_40 + 0x78);
                iVar2 = transitionCount(this);
                UVar1 = arrayEqual(a1,a2,(int)iVar2);
                local_41 = UVar1 != '\0';
              }
            }
          }
        }
        this_local._7_1_ = local_41;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
OlsonTimeZone::hasSameRules(const TimeZone &other) const {
    if (this == &other) {
        return TRUE;
    }
    const OlsonTimeZone* z = dynamic_cast<const OlsonTimeZone*>(&other);
    if (z == NULL) {
        return FALSE;
    }

    // [sic] pointer comparison: typeMapData points into
    // memory-mapped or DLL space, so if two zones have the same
    // pointer, they are equal.
    if (typeMapData == z->typeMapData) {
        return TRUE;
    }
    
    // If the pointers are not equal, the zones may still
    // be equal if their rules and transitions are equal
    if ((finalZone == NULL && z->finalZone != NULL)
        || (finalZone != NULL && z->finalZone == NULL)
        || (finalZone != NULL && z->finalZone != NULL && *finalZone != *z->finalZone)) {
        return FALSE;
    }

    if (finalZone != NULL) {
        if (finalStartYear != z->finalStartYear || finalStartMillis != z->finalStartMillis) {
            return FALSE;
        }
    }
    if (typeCount != z->typeCount
        || transitionCountPre32 != z->transitionCountPre32
        || transitionCount32 != z->transitionCount32
        || transitionCountPost32 != z->transitionCountPost32) {
        return FALSE;
    }

    return
        arrayEqual(transitionTimesPre32, z->transitionTimesPre32, sizeof(transitionTimesPre32[0]) * transitionCountPre32 << 1)
        && arrayEqual(transitionTimes32, z->transitionTimes32, sizeof(transitionTimes32[0]) * transitionCount32)
        && arrayEqual(transitionTimesPost32, z->transitionTimesPost32, sizeof(transitionTimesPost32[0]) * transitionCountPost32 << 1)
        && arrayEqual(typeOffsets, z->typeOffsets, sizeof(typeOffsets[0]) * typeCount << 1)
        && arrayEqual(typeMapData, z->typeMapData, sizeof(typeMapData[0]) * transitionCount());
}